

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.cc
# Opt level: O1

int X509_ALGOR_set0(X509_ALGOR *alg,ASN1_OBJECT *aobj,int ptype,void *pval)

{
  ASN1_TYPE *pAVar1;
  int iVar2;
  
  iVar2 = 0;
  if (alg != (X509_ALGOR *)0x0) {
    if (ptype != -1) {
      if (alg->parameter == (ASN1_TYPE *)0x0) {
        pAVar1 = ASN1_TYPE_new();
        alg->parameter = pAVar1;
      }
      if (alg->parameter == (ASN1_TYPE *)0x0) {
        return 0;
      }
    }
    ASN1_OBJECT_free(alg->algorithm);
    alg->algorithm = aobj;
    iVar2 = 1;
    if (ptype != 0) {
      if (ptype == -1) {
        if (alg->parameter != (ASN1_TYPE *)0x0) {
          ASN1_TYPE_free(alg->parameter);
          alg->parameter = (ASN1_TYPE *)0x0;
        }
      }
      else {
        ASN1_TYPE_set(alg->parameter,ptype,pval);
      }
    }
  }
  return iVar2;
}

Assistant:

int X509_ALGOR_set0(X509_ALGOR *alg, ASN1_OBJECT *aobj, int ptype, void *pval) {
  if (!alg) {
    return 0;
  }
  if (ptype != V_ASN1_UNDEF) {
    if (alg->parameter == NULL) {
      alg->parameter = ASN1_TYPE_new();
    }
    if (alg->parameter == NULL) {
      return 0;
    }
  }
  if (alg) {
    ASN1_OBJECT_free(alg->algorithm);
    alg->algorithm = aobj;
  }
  if (ptype == 0) {
    return 1;
  }
  if (ptype == V_ASN1_UNDEF) {
    if (alg->parameter) {
      ASN1_TYPE_free(alg->parameter);
      alg->parameter = NULL;
    }
  } else {
    ASN1_TYPE_set(alg->parameter, ptype, pval);
  }
  return 1;
}